

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::CollectOriginalDirectories(cmOrderDirectories *this)

{
  bool bVar1;
  reference ppcVar2;
  cmOrderDirectoriesConstraint *entry;
  iterator __end1;
  iterator __begin1;
  vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_> *__range1;
  cmOrderDirectories *this_local;
  
  AddOriginalDirectories(this,&this->UserDirectories);
  __end1 = std::
           vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>::
           begin(&this->ConstraintEntries);
  entry = (cmOrderDirectoriesConstraint *)
          std::
          vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>::
          end(&this->ConstraintEntries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmOrderDirectoriesConstraint_**,_std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmOrderDirectoriesConstraint_**,_std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>_>
              ::operator*(&__end1);
    cmOrderDirectoriesConstraint::AddDirectory(*ppcVar2);
    __gnu_cxx::
    __normal_iterator<cmOrderDirectoriesConstraint_**,_std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>_>
    ::operator++(&__end1);
  }
  AddOriginalDirectories(this,&this->LanguageDirectories);
  return;
}

Assistant:

void cmOrderDirectories::CollectOriginalDirectories()
{
  // Add user directories specified for inclusion.  These should be
  // indexed first so their original order is preserved as much as
  // possible subject to the constraints.
  this->AddOriginalDirectories(this->UserDirectories);

  // Add directories containing constraints.
  for (cmOrderDirectoriesConstraint* entry : this->ConstraintEntries) {
    entry->AddDirectory();
  }

  // Add language runtime directories last.
  this->AddOriginalDirectories(this->LanguageDirectories);
}